

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O2

size_type __thiscall
std::experimental::detail::
dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,3ul>
::operator()(dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,3ul>
             *this,dimensions<18446744073709551615UL,_5UL,_9UL> d0)

{
  value_type vVar1;
  dynamic_dims_array local_8;
  
  local_8._M_elems[0] = (_Type)(_Type)d0.dynamic_dims_._M_elems[0];
  vVar1 = dimensions<18446744073709551615UL,_5UL,_9UL>::operator[]<unsigned_long>
                    ((dimensions<18446744073709551615UL,_5UL,_9UL> *)&local_8,0);
  return vVar1 * 0x2d;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
        ) const noexcept
    {
        static_assert(
            std::rank<dimensions<Dims0...> >::value == Size 
          , "Size not equal to rank of argument"
        );
        return Reduction()(
            Op()(d0[Idx])
          , dims_unary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0))
        );
    }